

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

int Dch_ObjCountSupp_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = p->nTravIds;
  iVar3 = 0;
  if (pObj->TravId != iVar2) {
    iVar3 = 0;
    do {
      pObj->TravId = iVar2;
      uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((uVar1 & 7) == 2) {
        iVar2 = 1;
        goto LAB_0091859b;
      }
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                      ,0x35,"int Dch_ObjCountSupp_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      iVar2 = Dch_ObjCountSupp_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar3 = iVar3 + iVar2;
      iVar2 = p->nTravIds;
    } while (pObj->TravId != iVar2);
    iVar2 = 0;
LAB_0091859b:
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Counts support nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dch_ObjCountSupp_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int Count;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
        return 1;
    assert( Aig_ObjIsNode(pObj) );
    Count  = Dch_ObjCountSupp_rec( p, Aig_ObjFanin0(pObj) );
    Count += Dch_ObjCountSupp_rec( p, Aig_ObjFanin1(pObj) );
    return Count;
}